

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(SequentialAnchorData *this)

{
  double dVar1;
  long lVar2;
  AnchorData **ppAVar3;
  long lVar4;
  long lVar5;
  AnchorVertex **ppAVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  qreal qVar10;
  qreal qVar11;
  
  (this->super_AnchorData).maxSize = 0.0;
  (this->super_AnchorData).minPrefSize = 0.0;
  (this->super_AnchorData).minSize = 0.0;
  (this->super_AnchorData).prefSize = 0.0;
  (this->super_AnchorData).maxPrefSize = 0.0;
  lVar2 = (this->m_edges).d.size;
  if (lVar2 != 0) {
    ppAVar3 = (this->m_edges).d.ptr;
    qVar9 = (this->super_AnchorData).minPrefSize;
    qVar7 = (this->super_AnchorData).maxPrefSize;
    qVar10 = (this->super_AnchorData).prefSize;
    qVar8 = (this->super_AnchorData).maxSize;
    qVar11 = (this->super_AnchorData).minSize;
    ppAVar6 = &(this->super_AnchorData).from;
    lVar5 = 0;
    do {
      lVar4 = *(long *)((long)ppAVar3 + lVar5);
      if (*(AnchorVertex **)(lVar4 + 0x18) == *ppAVar6) {
        qVar11 = qVar11 + *(double *)(lVar4 + 0x28);
        (this->super_AnchorData).minSize = qVar11;
        qVar9 = qVar9 + *(double *)(lVar4 + 0x40);
        qVar7 = qVar7 + *(double *)(lVar4 + 0x48);
        qVar10 = qVar10 + *(double *)(lVar4 + 0x30);
        qVar8 = qVar8 + *(double *)(lVar4 + 0x38);
        (this->super_AnchorData).prefSize = qVar10;
        (this->super_AnchorData).maxSize = qVar8;
        (this->super_AnchorData).minPrefSize = qVar9;
        (this->super_AnchorData).maxPrefSize = qVar7;
        ppAVar6 = (AnchorVertex **)(lVar4 + 0x20);
      }
      else {
        ppAVar6 = (AnchorVertex **)(lVar4 + 0x18);
        qVar10 = qVar10 - *(double *)(lVar4 + 0x30);
        qVar11 = qVar11 - *(double *)(lVar4 + 0x38);
        dVar1 = *(double *)(lVar4 + 0x48);
        (this->super_AnchorData).minSize = qVar11;
        (this->super_AnchorData).prefSize = qVar10;
        qVar8 = qVar8 - *(double *)(lVar4 + 0x28);
        qVar9 = qVar9 - dVar1;
        (this->super_AnchorData).maxSize = qVar8;
        (this->super_AnchorData).minPrefSize = qVar9;
        qVar7 = qVar7 - *(double *)(lVar4 + 0x40);
        (this->super_AnchorData).maxPrefSize = qVar7;
      }
      lVar5 = lVar5 + 8;
    } while (lVar2 << 3 != lVar5);
  }
  qVar11 = (this->super_AnchorData).prefSize;
  (this->super_AnchorData).sizeAtMinimum = qVar11;
  (this->super_AnchorData).sizeAtPreferred = qVar11;
  (this->super_AnchorData).sizeAtMaximum = qVar11;
  return;
}

Assistant:

void SequentialAnchorData::calculateSizeHints()
{
    minSize = 0;
    prefSize = 0;
    maxSize = 0;
    minPrefSize = 0;
    maxPrefSize = 0;

    AnchorVertex *prev = from;

    for (AnchorData *edge : m_edges) {
        const bool edgeIsForward = (edge->from == prev);
        if (edgeIsForward) {
            minSize += edge->minSize;
            prefSize += edge->prefSize;
            maxSize += edge->maxSize;
            minPrefSize += edge->minPrefSize;
            maxPrefSize += edge->maxPrefSize;
            prev = edge->to;
        } else {
            Q_ASSERT(prev == edge->to);
            minSize -= edge->maxSize;
            prefSize -= edge->prefSize;
            maxSize -= edge->minSize;
            minPrefSize -= edge->maxPrefSize;
            maxPrefSize -= edge->minPrefSize;
            prev = edge->from;
        }
    }

    // See comment in AnchorData::refreshSizeHints() about sizeAt* values
    sizeAtMinimum = prefSize;
    sizeAtPreferred = prefSize;
    sizeAtMaximum = prefSize;
}